

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O1

void deqp::gles3::Functional::attachmentQueryTex2DTest(TestContext *testCtx,Context *ctx)

{
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8ce0,0xde1,1,0);
  checkFboAttachmentParam(testCtx,ctx,0x8ce0,0x8cd0,0x1702);
  checkFboAttachmentParam(testCtx,ctx,0x8ce0,0x8cd1,1);
  checkFboAttachmentParam(testCtx,ctx,0x8ce0,0x8cd2,0);
  checkFboAttachmentParam(testCtx,ctx,0x8ce0,0x8cd3,0);
  return;
}

Assistant:

static void attachmentQueryTex2DTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	ctx.bindTexture(GL_TEXTURE_2D, 1);
	ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 1, 0);

	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 1);
	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, 0);
	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, 0);
}